

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,LogicalType *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  undefined8 uVar1;
  undefined8 in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff30;
  string local_a8;
  string local_88 [32];
  string local_68 [32];
  LogicalType local_48;
  
  ::std::__cxx11::string::string((string *)&local_a8,(string *)fmt_str);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff38,(string *)params);
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff20,(LogicalType *)params_1);
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff08,params_2);
  ::std::__cxx11::string::string((string *)&local_48,(string *)params_3);
  ::std::__cxx11::string::string(local_68,(string *)params_4._M_dataplus._M_p);
  uVar1 = 0x163e408;
  ::std::__cxx11::string::string(local_88,(string *)params_4._M_string_length);
  params_4_00._M_string_length = (size_type)local_88;
  params_4_00._M_dataplus._M_p = (pointer)local_68;
  params_4_00.field_2._M_allocated_capacity = uVar1;
  params_4_00.field_2._8_1_ = (LogicalTypeId)in_stack_ffffffffffffff08;
  params_4_00.field_2._9_1_ = SUB81(in_stack_ffffffffffffff08,1);
  params_4_00.field_2._10_6_ = SUB86(in_stack_ffffffffffffff08,2);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff20,(LogicalType *)&stack0xffffffffffffff08,&local_48,params_4_00,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff30);
  ::std::__cxx11::string::~string(local_88);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff08);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff20);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  ::std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}